

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O0

int Mf_CutRef_rec(Mf_Man_t *p,int *pCut)

{
  int iVar1;
  int iFunc;
  Mf_Obj_t *pMVar2;
  int *pCut_00;
  int local_20;
  int local_1c;
  int Count;
  int i;
  int *pCut_local;
  Mf_Man_t *p_local;
  
  iVar1 = Mf_CutSize(pCut);
  iFunc = Mf_CutFunc(pCut);
  local_20 = Mf_CutArea(p,iVar1,iFunc);
  local_1c = 1;
  while( true ) {
    iVar1 = Mf_CutSize(pCut);
    if (iVar1 < local_1c) break;
    iVar1 = Mf_ObjMapRefInc(p,pCut[local_1c]);
    if (iVar1 == 0) {
      pMVar2 = Mf_ManObj(p,pCut[local_1c]);
      if (pMVar2->iCutSet != 0) {
        pCut_00 = Mf_ObjCutBest(p,pCut[local_1c]);
        iVar1 = Mf_CutRef_rec(p,pCut_00);
        local_20 = iVar1 + local_20;
      }
    }
    local_1c = local_1c + 1;
  }
  return local_20;
}

Assistant:

int Mf_CutRef_rec( Mf_Man_t * p, int * pCut )
{
    int i, Count = Mf_CutArea(p, Mf_CutSize(pCut), Mf_CutFunc(pCut));
    for ( i = 1; i <= Mf_CutSize(pCut); i++ )
        if ( !Mf_ObjMapRefInc(p, pCut[i]) && Mf_ManObj(p, pCut[i])->iCutSet )
            Count += Mf_CutRef_rec( p, Mf_ObjCutBest(p, pCut[i]) );
    return Count;
}